

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_replaceRangeAString_success_indexAndRangeBeyondSize_bufferExpanded_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  char *local_98;
  undefined8 uStack_90;
  AString replacement;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 6;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x13dd75;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"012345",7);
  replacement.buffer = (char *)0x0;
  replacement.reallocator._0_4_ = 0x11e238;
  replacement.reallocator._4_4_ = 0;
  replacement.deallocator._0_4_ = 0x11e278;
  replacement.deallocator._4_4_ = 0;
  replacement.size = 3;
  replacement.capacity = 3;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x13ddd7;
  replacement.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,4);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(replacement.buffer,"678",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x13de12;
  bVar1 = AString_replaceRangeAString(&string,0x2a,0x29a,&replacement);
  if (bVar1 == false) {
    uStack_90 = 0x13dfaa;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x704,
                      "Assertion \'AString_replaceRangeAString(&string, 42, 666, &replacement)\' failed"
                      ,0,0);
  }
  uStack_90 = 0x13de2b;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x704);
  if (string.capacity != 0x10) {
    pcStack_a0 = "(16)";
    pcVar6 = "(string).capacity == (16)";
    pcVar7 = "(string).capacity";
    iVar2 = 0x705;
    local_98 = (char *)0x10;
    pcVar8 = (char *)string.capacity;
LAB_0013e1e9:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &pcStack_a0;
    goto LAB_0013e1eb;
  }
  uStack_90 = 0x13de4b;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x705);
  if (string.buffer == (char *)0x0) {
    pcVar7 = "(void*) (string).buffer != NULL";
    pcVar8 = "(void*) (string).buffer";
    iVar2 = 0x705;
LAB_0013e111:
    uStack_90 = 0;
    local_98 = (char *)0x0;
    pcStack_a0 = (char *)0x13e118;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x",pcVar7,pcVar8);
  }
  uStack_90 = 0x13de68;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x705);
  pcVar4 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar8 = "";
    pcVar4 = "(null)";
LAB_0013e033:
    pcStack_a0 = "012345678";
    pcStack_b0 = "(\"012345678\")";
    pcVar6 = "(string).buffer == (\"012345678\")";
    pcVar7 = "(void*) (string).buffer";
    iVar2 = 0x705;
  }
  else {
    uStack_90 = 0x13de85;
    iVar2 = strcmp("012345678",string.buffer);
    if (iVar2 != 0) {
      pcVar8 = "\"";
      goto LAB_0013e033;
    }
    uStack_90 = 0x13de9e;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x705);
    if (string.size != 9) {
      pcStack_a0 = "strlen(\"012345678\")";
      pcVar6 = "(string).size == strlen(\"012345678\")";
      pcVar7 = "(string).size";
      iVar2 = 0x705;
      local_98 = (char *)0x9;
      pcVar8 = (char *)string.size;
      goto LAB_0013e1e9;
    }
    uStack_90 = 0x13debe;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x705);
    if (replacement.capacity != 3) {
      pcStack_a0 = "(3)";
      pcVar6 = "(replacement).capacity == (3)";
      pcVar7 = "(replacement).capacity";
      pcVar8 = (char *)replacement.capacity;
LAB_0013e1a7:
      iVar2 = 0x706;
      local_98 = (char *)0x3;
      goto LAB_0013e1e9;
    }
    uStack_90 = 0x13dede;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x706);
    if (replacement.buffer == (char *)0x0) {
      pcVar7 = "(void*) (replacement).buffer != NULL";
      pcVar8 = "(void*) (replacement).buffer";
      iVar2 = 0x706;
      goto LAB_0013e111;
    }
    uStack_90 = 0x13defb;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x706);
    pcVar4 = replacement.buffer;
    if (replacement.buffer == (char *)0x0) {
      pcVar4 = "(null)";
      pcVar8 = "";
    }
    else {
      uStack_90 = 0x13df18;
      iVar2 = strcmp("678",replacement.buffer);
      if (iVar2 == 0) {
        uStack_90 = 0x13df31;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x706);
        if (replacement.size == 3) {
          uStack_90 = 0x13df51;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x706);
          if (private_ACUtilsTest_AString_reallocCount == 1) {
            uStack_90 = 0x13df73;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x707);
            uStack_90 = 0x13df7c;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            uStack_90 = 0x13df85;
            (*(code *)CONCAT44(replacement.deallocator._4_4_,replacement.deallocator._0_4_))
                      (replacement.buffer);
            return;
          }
          pcStack_a0 = "(1)";
          pcVar6 = "private_ACUtilsTest_AString_reallocCount == (1)";
          pcVar7 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x707;
          local_98 = (char *)0x1;
          pcVar8 = (char *)private_ACUtilsTest_AString_reallocCount;
          goto LAB_0013e1e9;
        }
        pcStack_a0 = "strlen(\"678\")";
        pcVar6 = "(replacement).size == strlen(\"678\")";
        pcVar7 = "(replacement).size";
        pcVar8 = (char *)replacement.size;
        goto LAB_0013e1a7;
      }
      pcVar8 = "\"";
    }
    pcStack_a0 = "678";
    pcStack_b0 = "(\"678\")";
    pcVar6 = "(replacement).buffer == (\"678\")";
    pcVar7 = "(void*) (replacement).buffer";
    iVar2 = 0x706;
  }
  pcVar7 = pcVar7 + 8;
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_98 = "\"";
  pcStack_a8 = "\"";
  ppcVar5 = &pcStack_c0;
  pcStack_c0 = pcVar4;
  pcStack_b8 = pcVar8;
LAB_0013e1eb:
  uStack_90 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) =
       test_AString_replaceRangeAString_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed_fn
  ;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRangeAString_success_indexAndRangeBeyondSize_bufferExpanded)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012345", 8);
    struct AString replacement = private_ACUtilsTest_AString_constructTestString("678", 3);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRangeAString(&string, 42, 666, &replacement));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012345678", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(replacement, "678", 3);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    private_ACUtilsTest_AString_destructTestString(string);
    private_ACUtilsTest_AString_destructTestString(replacement);
}